

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::getGrid
          (QDockAreaLayout *this,QList<QLayoutStruct> *_ver_struct_list,
          QList<QLayoutStruct> *_hor_struct_list)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  reference pQVar7;
  reference pQVar8;
  int *piVar9;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int bottom;
  int top;
  bool br_significant_1;
  bool bl_significant_1;
  bool tr_significant_1;
  bool tl_significant_1;
  QList<QLayoutStruct> *hor_struct_list;
  int i;
  int right;
  int left;
  bool br_significant;
  bool tr_significant;
  bool bl_significant;
  bool tl_significant;
  QList<QLayoutStruct> *ver_struct_list;
  bool have_central;
  QSize bottom_max;
  QSize bottom_min;
  QSize bottom_hint;
  QSize top_max;
  QSize top_min;
  QSize top_hint;
  QSize right_max;
  QSize right_min;
  QSize right_hint;
  QSize left_max;
  QSize left_min;
  QSize left_hint;
  QRect center_rect;
  QSize center_max;
  QSize center_min;
  QSize center_hint;
  QRect *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined2 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda2;
  undefined1 in_stack_fffffffffffffda3;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  bool local_223;
  bool local_222;
  bool local_221;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  bool local_201;
  bool local_1bd;
  bool local_1a3;
  bool local_1a2;
  bool local_1a1;
  bool local_181;
  byte local_161;
  int local_160;
  int local_148;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88);
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88);
  local_161 = 0;
  if (*(long *)(in_RDI + 8) != 0) {
    local_161 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))();
    local_161 = local_161 ^ 0xff;
  }
  bVar2 = (bool)(local_161 & 1);
  if (bVar2 != false) {
    QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,
                                  CONCAT13(in_stack_fffffffffffffda3,
                                           CONCAT12(in_stack_fffffffffffffda2,
                                                    in_stack_fffffffffffffda0))));
    bVar3 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffda4,
                                             CONCAT13(in_stack_fffffffffffffda3,
                                                      CONCAT12(in_stack_fffffffffffffda2,
                                                               in_stack_fffffffffffffda0))));
    if (!bVar3) {
      (**(code **)(**(long **)(in_RDI + 8) + 0x10))();
    }
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
    (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
  }
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x578d07);
  if (!bVar3) {
    QRect::left((QRect *)0x578d1c);
    QRect::width(in_stack_fffffffffffffd88);
    QRect::setLeft((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x578d76);
  if (!bVar3) {
    QRect::top((QRect *)0x578d8b);
    QRect::height(in_stack_fffffffffffffd88);
    QRect::setTop((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                  (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x578de9);
  if (!bVar3) {
    QRect::right((QRect *)0x578dfe);
    QRect::width(in_stack_fffffffffffffd88);
    QRect::setRight((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x578e5c);
  if (!bVar3) {
    QRect::bottom((QRect *)0x578e71);
    QRect::height(in_stack_fffffffffffffd88);
    QRect::setBottom((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  QDockAreaLayoutInfo::size
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar3 = QSize::isNull((QSize *)CONCAT44(in_stack_fffffffffffffda4,
                                          CONCAT13(in_stack_fffffffffffffda3,
                                                   CONCAT12(in_stack_fffffffffffffda2,
                                                            in_stack_fffffffffffffda0))));
  if ((bVar3) || ((*(byte *)(in_RDI + 0x81) & 1) != 0)) {
    QDockAreaLayoutInfo::sizeHint
              ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
  }
  QDockAreaLayoutInfo::minimumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  QDockAreaLayoutInfo::maximumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QDockAreaLayoutInfo::size
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar3 = QSize::isNull((QSize *)CONCAT44(in_stack_fffffffffffffda4,
                                          CONCAT13(in_stack_fffffffffffffda3,
                                                   CONCAT12(in_stack_fffffffffffffda2,
                                                            in_stack_fffffffffffffda0))));
  if ((bVar3) || ((*(byte *)(in_RDI + 0x81) & 1) != 0)) {
    QDockAreaLayoutInfo::sizeHint
              ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
  }
  QDockAreaLayoutInfo::minimumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  QDockAreaLayoutInfo::maximumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QDockAreaLayoutInfo::size
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar3 = QSize::isNull((QSize *)CONCAT44(in_stack_fffffffffffffda4,
                                          CONCAT13(in_stack_fffffffffffffda3,
                                                   CONCAT12(in_stack_fffffffffffffda2,
                                                            in_stack_fffffffffffffda0))));
  if ((bVar3) || ((*(byte *)(in_RDI + 0x81) & 1) != 0)) {
    QDockAreaLayoutInfo::sizeHint
              ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
  }
  QDockAreaLayoutInfo::minimumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  QDockAreaLayoutInfo::maximumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QDockAreaLayoutInfo::size
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar3 = QSize::isNull((QSize *)CONCAT44(in_stack_fffffffffffffda4,
                                          CONCAT13(in_stack_fffffffffffffda3,
                                                   CONCAT12(in_stack_fffffffffffffda2,
                                                            in_stack_fffffffffffffda0))));
  if ((bVar3) || ((*(byte *)(in_RDI + 0x81) & 1) != 0)) {
    QDockAreaLayoutInfo::sizeHint
              ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
  }
  QDockAreaLayoutInfo::minimumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  QDockAreaLayoutInfo::maximumSize
            ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    (QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if (in_RSI != 0) {
    QList<QLayoutStruct>::resize
              ((QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffda4,
                        CONCAT13(in_stack_fffffffffffffda3,
                                 CONCAT12(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0))),
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = 0;
    iVar5 = QSize::height((QSize *)0x5793ba);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar5;
    iVar5 = QSize::height((QSize *)0x5793e9);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar5;
    iVar5 = QSize::height((QSize *)0x579418);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579467);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = bVar3;
    iVar5 = QRect::top((QRect *)0x5794a8);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar5;
    iVar5 = QRect::height(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    iVar5 = QSize::height((QSize *)0x579533);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = iVar5;
    local_181 = true;
    if (*in_RDI != 4) {
      local_181 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579583);
    }
    local_1a1 = true;
    if (in_RDI[2] != 8) {
      local_1a1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x5795c9);
    }
    local_1a2 = true;
    if (in_RDI[1] != 4) {
      local_1a2 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57960f);
    }
    local_1a3 = true;
    if (in_RDI[3] != 8) {
      local_1a3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579655);
    }
    if ((local_181 != false) && (local_1a1 != false)) {
      QSize::height((QSize *)0x57968d);
    }
    if ((local_1a2 != false) && (local_1a3 != false)) {
      QSize::height((QSize *)0x5796d0);
    }
    QSize::height((QSize *)0x57970d);
    iVar5 = qMax((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88,0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar5;
    if ((local_181 != false) && (local_1a1 != false)) {
      QSize::height((QSize *)0x579766);
    }
    if ((local_1a2 != false) && (local_1a3 != false)) {
      QSize::height((QSize *)0x5797a9);
    }
    QSize::height((QSize *)0x5797e6);
    iVar5 = qMax((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88,0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar5;
    iVar5 = QSize::height((QSize *)0x57982b);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = bVar2;
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57988c);
    local_1bd = false;
    if ((bVar3) && (local_1bd = false, bVar2 == false)) {
      local_1bd = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x5798c6);
    }
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = local_1bd;
    iVar5 = QRect::top((QRect *)0x579907);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar5;
    iVar5 = QRect::height(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = 0;
    iVar5 = QSize::height((QSize *)0x57999d);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar5;
    iVar5 = QSize::height((QSize *)0x5799cd);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar5;
    iVar5 = QSize::height((QSize *)0x5799fd);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579a4e);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = bVar3;
    iVar5 = QRect::top((QRect *)0x579a90);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar5;
    iVar5 = QRect::height(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar5;
    for (local_148 = 0; local_148 < 3; local_148 = local_148 + 1) {
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      piVar9 = qMax<int>(&pQVar7->sizeHint,&pQVar8->minimumSize);
      iVar5 = *piVar9;
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      pQVar7->sizeHint = iVar5;
    }
    if (((bVar2 != false) &&
        (pQVar7 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             (qsizetype)in_stack_fffffffffffffd88), (pQVar7->empty & 1U) != 0)) &&
       (pQVar7 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (qsizetype)in_stack_fffffffffffffd88), (pQVar7->empty & 1U) != 0)) {
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      pQVar7->maximumSize = 0xffffff;
    }
  }
  if (in_RDX != 0) {
    QList<QLayoutStruct>::resize
              ((QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffda4,
                        CONCAT13(in_stack_fffffffffffffda3,
                                 CONCAT12(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0))),
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = 0;
    iVar5 = QSize::width((QSize *)0x579c65);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar5;
    iVar5 = QSize::width((QSize *)0x579c8e);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar5;
    iVar5 = QSize::width((QSize *)0x579cb7);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579cf9);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = bVar3;
    iVar5 = QRect::left((QRect *)0x579d2d);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar5;
    iVar5 = QRect::width(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar5;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    iVar5 = QSize::width((QSize *)0x579da5);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = iVar5;
    local_201 = true;
    if (*in_RDI != 1) {
      local_201 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579de5);
    }
    local_221 = true;
    if (in_RDI[1] != 2) {
      local_221 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579e1f);
    }
    local_222 = true;
    if (in_RDI[2] != 1) {
      local_222 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579e55);
    }
    local_223 = true;
    if (in_RDI[3] != 2) {
      local_223 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x579e8f);
    }
    if ((local_201 != false) && (local_221 != false)) {
      QSize::width((QSize *)0x579ec1);
    }
    if ((local_222 != false) && (local_223 != false)) {
      QSize::width((QSize *)0x579efb);
    }
    QSize::width((QSize *)0x579f2c);
    iVar5 = qMax((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88,0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar5;
    if ((local_201 == false) || (local_221 == false)) {
      iVar5 = 0;
    }
    else {
      iVar5 = QSize::width((QSize *)0x579f7c);
    }
    if ((local_222 != false) && (local_223 != false)) {
      QSize::width((QSize *)0x579fb6);
    }
    QSize::width((QSize *)0x579fe7);
    iVar6 = qMax((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88,0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar6;
    iVar6 = QSize::width((QSize *)0x57a023);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar6;
    bVar4 = bVar2;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = (bool)(bVar4 & 1);
    bVar4 = bVar2 ^ 0xff;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = (bool)(bVar4 & 1);
    iVar6 = QRect::left((QRect *)0x57a09d);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar6;
    iVar6 = QRect::width(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar6;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    QLayoutStruct::init(pQVar7,(EVP_PKEY_CTX *)0x0);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->stretch = 0;
    iVar6 = QSize::width((QSize *)0x57a127);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->sizeHint = iVar6;
    iVar6 = QSize::width((QSize *)0x57a151);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->minimumSize = iVar6;
    iVar6 = QSize::width((QSize *)0x57a17b);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->maximumSize = iVar6;
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57a1c3);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->empty = bVar3;
    iVar6 = QRect::left((QRect *)0x57a1fc);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->pos = iVar6;
    iVar6 = QRect::width(in_stack_fffffffffffffd88);
    pQVar7 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                        (qsizetype)in_stack_fffffffffffffd88);
    pQVar7->size = iVar6;
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd88 = (QRect *)&pQVar7->sizeHint;
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      piVar9 = qMax<int>((int *)in_stack_fffffffffffffd88,&pQVar7->minimumSize);
      in_stack_fffffffffffffd90 = *piVar9;
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      pQVar7->sizeHint = in_stack_fffffffffffffd90;
    }
    if (((bVar2 != false) &&
        (pQVar7 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                             (qsizetype)in_stack_fffffffffffffd88), (pQVar7->empty & 1U) != 0)) &&
       (pQVar7 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                            (qsizetype)in_stack_fffffffffffffd88), (pQVar7->empty & 1U) != 0)) {
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),
                          (qsizetype)in_stack_fffffffffffffd88);
      pQVar7->maximumSize = 0xffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::getGrid(QList<QLayoutStruct> *_ver_struct_list,
                              QList<QLayoutStruct> *_hor_struct_list)
{
    QSize center_hint(0, 0);
    QSize center_min(0, 0);
    QSize center_max(0, 0);
    const bool have_central = centralWidgetItem != nullptr && !centralWidgetItem->isEmpty();
    if (have_central) {
        center_hint = centralWidgetRect.size();
        if (!center_hint.isValid())
            center_hint = centralWidgetItem->sizeHint();
        center_min = centralWidgetItem->minimumSize();
        center_max = centralWidgetItem->maximumSize();
    }

    QRect center_rect = rect;
    if (!docks[QInternal::LeftDock].isEmpty())
        center_rect.setLeft(rect.left() + docks[QInternal::LeftDock].rect.width() + sep);
    if (!docks[QInternal::TopDock].isEmpty())
        center_rect.setTop(rect.top() + docks[QInternal::TopDock].rect.height() + sep);
    if (!docks[QInternal::RightDock].isEmpty())
        center_rect.setRight(rect.right() - docks[QInternal::RightDock].rect.width() - sep);
    if (!docks[QInternal::BottomDock].isEmpty())
        center_rect.setBottom(rect.bottom() - docks[QInternal::BottomDock].rect.height() - sep);

    QSize left_hint = docks[QInternal::LeftDock].size();
    if (left_hint.isNull() || fallbackToSizeHints)
        left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize left_max = docks[QInternal::LeftDock].maximumSize();
    left_hint = left_hint.boundedTo(left_max).expandedTo(left_min);

    QSize right_hint = docks[QInternal::RightDock].size();
    if (right_hint.isNull() || fallbackToSizeHints)
        right_hint = docks[QInternal::RightDock].sizeHint();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize right_max = docks[QInternal::RightDock].maximumSize();
    right_hint = right_hint.boundedTo(right_max).expandedTo(right_min);

    QSize top_hint = docks[QInternal::TopDock].size();
    if (top_hint.isNull() || fallbackToSizeHints)
        top_hint = docks[QInternal::TopDock].sizeHint();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize top_max = docks[QInternal::TopDock].maximumSize();
    top_hint = top_hint.boundedTo(top_max).expandedTo(top_min);

    QSize bottom_hint = docks[QInternal::BottomDock].size();
    if (bottom_hint.isNull() || fallbackToSizeHints)
        bottom_hint = docks[QInternal::BottomDock].sizeHint();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();
    QSize bottom_max = docks[QInternal::BottomDock].maximumSize();
    bottom_hint = bottom_hint.boundedTo(bottom_max).expandedTo(bottom_min);

    if (_ver_struct_list != nullptr) {
        QList<QLayoutStruct> &ver_struct_list = *_ver_struct_list;
        ver_struct_list.resize(3);

        // top --------------------------------------------------
        ver_struct_list[0].init();
        ver_struct_list[0].stretch = 0;
        ver_struct_list[0].sizeHint = top_hint.height();
        ver_struct_list[0].minimumSize = top_min.height();
        ver_struct_list[0].maximumSize = top_max.height();
        ver_struct_list[0].expansive = false;
        ver_struct_list[0].empty = docks[QInternal::TopDock].isEmpty();
        ver_struct_list[0].pos = docks[QInternal::TopDock].rect.top();
        ver_struct_list[0].size = docks[QInternal::TopDock].rect.height();

        // center --------------------------------------------------
        ver_struct_list[1].init();
        ver_struct_list[1].stretch = center_hint.height();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();

        int left = (tl_significant && bl_significant) ? left_hint.height() : 0;
        int right = (tr_significant && br_significant) ? right_hint.height() : 0;
        ver_struct_list[1].sizeHint = qMax(left, center_hint.height(), right);

        left = (tl_significant && bl_significant) ? left_min.height() : 0;
        right = (tr_significant && br_significant) ? right_min.height() : 0;
        ver_struct_list[1].minimumSize = qMax(left, center_min.height(), right);
        ver_struct_list[1].maximumSize = center_max.height();
        ver_struct_list[1].expansive = have_central;
        ver_struct_list[1].empty = docks[QInternal::LeftDock].isEmpty()
                                        && !have_central
                                        && docks[QInternal::RightDock].isEmpty();
        ver_struct_list[1].pos = center_rect.top();
        ver_struct_list[1].size = center_rect.height();

        // bottom --------------------------------------------------
        ver_struct_list[2].init();
        ver_struct_list[2].stretch = 0;
        ver_struct_list[2].sizeHint = bottom_hint.height();
        ver_struct_list[2].minimumSize = bottom_min.height();
        ver_struct_list[2].maximumSize = bottom_max.height();
        ver_struct_list[2].expansive = false;
        ver_struct_list[2].empty = docks[QInternal::BottomDock].isEmpty();
        ver_struct_list[2].pos = docks[QInternal::BottomDock].rect.top();
        ver_struct_list[2].size = docks[QInternal::BottomDock].rect.height();

        for (int i = 0; i < 3; ++i) {
            ver_struct_list[i].sizeHint
                = qMax(ver_struct_list[i].sizeHint, ver_struct_list[i].minimumSize);
        }
        if (have_central && ver_struct_list[0].empty && ver_struct_list[2].empty)
            ver_struct_list[1].maximumSize = QWIDGETSIZE_MAX;
    }

    if (_hor_struct_list != nullptr) {
        QList<QLayoutStruct> &hor_struct_list = *_hor_struct_list;
        hor_struct_list.resize(3);

        // left --------------------------------------------------
        hor_struct_list[0].init();
        hor_struct_list[0].stretch = 0;
        hor_struct_list[0].sizeHint = left_hint.width();
        hor_struct_list[0].minimumSize = left_min.width();
        hor_struct_list[0].maximumSize = left_max.width();
        hor_struct_list[0].expansive = false;
        hor_struct_list[0].empty = docks[QInternal::LeftDock].isEmpty();
        hor_struct_list[0].pos = docks[QInternal::LeftDock].rect.left();
        hor_struct_list[0].size = docks[QInternal::LeftDock].rect.width();

        // center --------------------------------------------------
        hor_struct_list[1].init();
        hor_struct_list[1].stretch = center_hint.width();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();

        int top = (tl_significant && tr_significant) ? top_hint.width() : 0;
        int bottom = (bl_significant && br_significant) ? bottom_hint.width() : 0;
        hor_struct_list[1].sizeHint = qMax(top, center_hint.width(), bottom);

        top = (tl_significant && tr_significant) ? top_min.width() : 0;
        bottom = (bl_significant && br_significant) ? bottom_min.width() : 0;
        hor_struct_list[1].minimumSize = qMax(top, center_min.width(), bottom);

        hor_struct_list[1].maximumSize = center_max.width();
        hor_struct_list[1].expansive = have_central;
        hor_struct_list[1].empty = !have_central;
        hor_struct_list[1].pos = center_rect.left();
        hor_struct_list[1].size = center_rect.width();

        // right --------------------------------------------------
        hor_struct_list[2].init();
        hor_struct_list[2].stretch = 0;
        hor_struct_list[2].sizeHint = right_hint.width();
        hor_struct_list[2].minimumSize = right_min.width();
        hor_struct_list[2].maximumSize = right_max.width();
        hor_struct_list[2].expansive = false;
        hor_struct_list[2].empty = docks[QInternal::RightDock].isEmpty();
        hor_struct_list[2].pos = docks[QInternal::RightDock].rect.left();
        hor_struct_list[2].size = docks[QInternal::RightDock].rect.width();

        for (int i = 0; i < 3; ++i) {
            hor_struct_list[i].sizeHint
                = qMax(hor_struct_list[i].sizeHint, hor_struct_list[i].minimumSize);
        }
        if (have_central && hor_struct_list[0].empty && hor_struct_list[2].empty)
            hor_struct_list[1].maximumSize = QWIDGETSIZE_MAX;

    }
}